

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMLSParserImpl::startDocument(DOMLSParserImpl *this)

{
  short sVar1;
  short sVar2;
  XMLStringPool *pXVar3;
  XMLScanner *pXVar4;
  long lVar5;
  ValueHashTableBucketElem<unsigned_int> *pVVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar9;
  long *plVar10;
  short *psVar11;
  void *pvVar12;
  undefined8 uVar13;
  DOMNode *pDVar14;
  XMLCh *pXVar15;
  uint *puVar16;
  undefined4 extraout_var_03;
  DOMDocumentImpl *pDVar17;
  short *psVar18;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> inScopeNS;
  ulong local_a8;
  ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher> local_98;
  long *local_68;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> local_60;
  undefined4 extraout_var_02;
  
  if (this->fWrapNodesInDocumentFragment == (DOMDocumentFragment *)0x0) {
    AbstractDOMParser::startDocument(&this->super_AbstractDOMParser);
    return;
  }
  iVar8 = (*(this->fWrapNodesInDocumentFragment->super_DOMNode)._vptr_DOMNode[0xc])();
  pDVar17 = (DOMDocumentImpl *)(CONCAT44(extraout_var,iVar8) + -8);
  if (CONCAT44(extraout_var,iVar8) == 0) {
    pDVar17 = (DOMDocumentImpl *)0x0;
  }
  (this->super_AbstractDOMParser).fDocument = pDVar17;
  pDVar14 = &this->fWrapNodesInDocumentFragment->super_DOMNode;
  (this->super_AbstractDOMParser).fCurrentNode = pDVar14;
  (this->super_AbstractDOMParser).fCurrentParent = pDVar14;
  pDVar17->errorChecking = false;
  local_60.fMemoryManager = (this->super_AbstractDOMParser).fMemoryManager;
  local_60.fBucketList = (ValueHashTableBucketElem<unsigned_int> **)0x0;
  local_60.fHashModulus = 7;
  local_60.fInitialModulus = 7;
  local_60.fCount = 0;
  iVar8 = (*(local_60.fMemoryManager)->_vptr_MemoryManager[3])();
  local_60.fBucketList = (ValueHashTableBucketElem<unsigned_int> **)CONCAT44(extraout_var_00,iVar8);
  memset(local_60.fBucketList,0,local_60.fHashModulus << 3);
  pDVar14 = this->fWrapNodesContext;
  while (pDVar14 != (DOMNode *)0x0) {
    iVar8 = (*pDVar14->_vptr_DOMNode[4])(pDVar14);
    if (iVar8 == 1) {
      iVar8 = (*pDVar14->_vptr_DOMNode[0xb])();
      local_68 = (long *)CONCAT44(extraout_var_01,iVar8);
      for (local_a8 = 0; plVar10 = local_68, uVar9 = (**(code **)(*local_68 + 0x28))(local_68),
          local_a8 < uVar9; local_a8 = local_a8 + 1) {
        plVar10 = (long *)(**(code **)(*plVar10 + 0x18))(plVar10);
        psVar11 = (short *)(**(code **)(*plVar10 + 0xb0))(plVar10);
        if (psVar11 == &XMLUni::fgXMLNSURIName) {
LAB_002e4041:
          pvVar12 = (void *)(**(code **)(*plVar10 + 0xc0))(plVar10);
          bVar7 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::containsKey
                            (&local_60,pvVar12);
          if (bVar7) goto LAB_002e4061;
          pvVar12 = (void *)(**(code **)(*plVar10 + 0xc0))(plVar10);
          pXVar3 = ((this->super_AbstractDOMParser).fScanner)->fURIStringPool;
          uVar13 = (**(code **)(*plVar10 + 0x18))(plVar10);
          iVar8 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3,uVar13);
          local_98.super_XMLEnumerator<unsigned_int>._vptr_XMLEnumerator._0_4_ = iVar8;
          ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::put
                    (&local_60,pvVar12,(uint *)&local_98);
        }
        else {
          psVar18 = &XMLUni::fgXMLNSURIName;
          if (psVar11 == (short *)0x0) {
LAB_002e403b:
            if (*psVar18 == 0) goto LAB_002e4041;
          }
          else {
            do {
              sVar1 = *psVar11;
              if (sVar1 == 0) goto LAB_002e403b;
              psVar11 = psVar11 + 1;
              sVar2 = *psVar18;
              psVar18 = psVar18 + 1;
            } while (sVar1 == sVar2);
          }
LAB_002e4061:
          psVar11 = (short *)(**(code **)(*plVar10 + 0x10))(plVar10);
          if (psVar11 == &XMLUni::fgXMLNSString) {
LAB_002e40a6:
            bVar7 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::containsKey
                              (&local_60,&XMLUni::fgZeroLenString);
            if (!bVar7) {
              pXVar3 = ((this->super_AbstractDOMParser).fScanner)->fURIStringPool;
              uVar13 = (**(code **)(*plVar10 + 0x18))(plVar10);
              iVar8 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3,uVar13);
              local_98.super_XMLEnumerator<unsigned_int>._vptr_XMLEnumerator._0_4_ = iVar8;
              ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::put
                        (&local_60,&XMLUni::fgZeroLenString,(uint *)&local_98);
            }
          }
          else {
            psVar18 = &XMLUni::fgXMLNSString;
            if (psVar11 == (short *)0x0) {
LAB_002e409c:
              if (*psVar18 == 0) goto LAB_002e40a6;
            }
            else {
              psVar18 = &XMLUni::fgXMLNSString;
              do {
                sVar1 = *psVar11;
                if (sVar1 == 0) goto LAB_002e409c;
                psVar11 = psVar11 + 1;
                sVar2 = *psVar18;
                psVar18 = psVar18 + 1;
              } while (sVar1 == sVar2);
            }
          }
        }
      }
    }
    iVar8 = (*pDVar14->_vptr_DOMNode[5])();
    pDVar14 = (DOMNode *)CONCAT44(extraout_var_02,iVar8);
  }
  local_98.fMemoryManager = (this->super_AbstractDOMParser).fMemoryManager;
  local_98.super_XMLEnumerator<unsigned_int>._vptr_XMLEnumerator =
       (_func_int **)&PTR__ValueHashTableOfEnumerator_004176c8;
  local_98.fAdopted = false;
  local_98.fCurElem = (ValueHashTableBucketElem<unsigned_int> *)0x0;
  local_98.fCurHash = 0;
  pVVar6 = local_98.fCurElem;
  if (local_60.fHashModulus != 0) {
    if (*local_60.fBucketList == (ValueHashTableBucketElem<unsigned_int> *)0x0) {
      local_98.fCurHash = 0;
      do {
        if (local_60.fHashModulus - 1 == local_98.fCurHash) {
          local_98.fCurHash = local_60.fHashModulus;
          pVVar6 = local_98.fCurElem;
          break;
        }
        lVar5 = local_98.fCurHash + 1;
        local_98.fCurHash = local_98.fCurHash + 1;
        pVVar6 = local_60.fBucketList[lVar5];
      } while (local_60.fBucketList[lVar5] == (ValueHashTableBucketElem<unsigned_int> *)0x0);
    }
    else {
      local_98.fCurHash = 0;
      pVVar6 = *local_60.fBucketList;
    }
  }
  local_98.fCurElem = pVVar6;
  local_98.fToEnum = &local_60;
  while ((local_98.fCurElem != (ValueHashTableBucketElem<unsigned_int> *)0x0 ||
         (local_98.fCurHash != (local_98.fToEnum)->fHashModulus))) {
    pXVar15 = (XMLCh *)ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher>::
                       nextElementKey(&local_98);
    pXVar4 = (this->super_AbstractDOMParser).fScanner;
    puVar16 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::get
                        (&local_60,pXVar15,XMLPlatformUtils::fgMemoryManager);
    ElemStack::addGlobalPrefix(&pXVar4->fElemStack,pXVar15,*puVar16);
  }
  if ((this->fWrapNodesAction == ACTION_REPLACE_CHILDREN) &&
     (iVar8 = (*this->fWrapNodesContext->_vptr_DOMNode[4])(), iVar8 == 9)) {
    pXVar4 = (this->super_AbstractDOMParser).fScanner;
    pDVar17 = (this->super_AbstractDOMParser).fDocument;
    iVar8 = (*(pXVar4->fReaderMgr).super_Locator._vptr_Locator[3])(&pXVar4->fReaderMgr);
    (*(pDVar17->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x5d])
              (pDVar17,CONCAT44(extraout_var_03,iVar8));
    pDVar17 = (this->super_AbstractDOMParser).fDocument;
    pXVar15 = ReaderMgr::getCurrentEncodingStr
                        (&((this->super_AbstractDOMParser).fScanner)->fReaderMgr);
    DOMDocumentImpl::setInputEncoding(pDVar17,pXVar15);
  }
  ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher>::~ValueHashTableOfEnumerator
            (&local_98);
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::~ValueHashTableOf(&local_60);
  return;
}

Assistant:

void DOMLSParserImpl::startDocument()
{
    if(fWrapNodesInDocumentFragment)
    {
        fDocument = (DOMDocumentImpl*)fWrapNodesInDocumentFragment->getOwnerDocument();
        fCurrentParent = fCurrentNode = fWrapNodesInDocumentFragment;
        // set DOM error checking off
        fDocument->setErrorChecking(false);

        // if we have namespaces in scope, push them down to the reader
        ValueHashTableOf<unsigned int> inScopeNS(7, fMemoryManager);
        DOMNode* cursor = fWrapNodesContext;
        while(cursor)
        {
            if(cursor->getNodeType()==DOMNode::ELEMENT_NODE)
            {
                DOMNamedNodeMap* attrs = cursor->getAttributes();
                for(XMLSize_t i=0; i<attrs->getLength(); i++)
                {
                    DOMNode* attr = attrs->item(i);
                    if(XMLString::equals(attr->getNamespaceURI(), XMLUni::fgXMLNSURIName) && !inScopeNS.containsKey(attr->getLocalName()))
                        inScopeNS.put((void*)attr->getLocalName(), fScanner->getURIStringPool()->addOrFind(attr->getNodeValue()));
                    else if(XMLString::equals(attr->getNodeName(), XMLUni::fgXMLNSString) && !inScopeNS.containsKey(XMLUni::fgZeroLenString))
                        inScopeNS.put((void*)XMLUni::fgZeroLenString, fScanner->getURIStringPool()->addOrFind(attr->getNodeValue()));
                }
            }
            cursor = cursor->getParentNode();
        }
        ValueHashTableOfEnumerator<unsigned int> iter(&inScopeNS, false, fMemoryManager);
        while(iter.hasMoreElements())
        {
            XMLCh* prefix = (XMLCh*)iter.nextElementKey();
            fScanner->addGlobalPrefix(prefix, inScopeNS.get(prefix));
        }

        // in this case the document URI and the input encoding must be propagated to the context document
        if(fWrapNodesAction==ACTION_REPLACE_CHILDREN && fWrapNodesContext->getNodeType()==DOMNode::DOCUMENT_NODE)
        {
            fDocument->setDocumentURI(fScanner->getLocator()->getSystemId());
            fDocument->setInputEncoding(fScanner->getReaderMgr()->getCurrentEncodingStr());
        }
    }
    else
        AbstractDOMParser::startDocument();
}